

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::DiscreteQuantileListFunction::GetAggregate
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType local_40;
  LogicalType local_28;
  
  GetDiscreteQuantileTemplated<duckdb::ListDiscreteQuantile>(__return_storage_ptr__,type);
  ::std::__cxx11::string::assign
            ((char *)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                      super_Function.name);
  __return_storage_ptr__->bind = Bind;
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = Deserialize;
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LIST(&local_28,&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_28);
  LogicalType::~LogicalType(&local_28);
  LogicalType::~LogicalType(&local_40);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetAggregate(const LogicalType &type) {
		auto fun = GetDiscreteQuantileList(type);
		fun.name = "quantile_disc";
		fun.bind = Bind;
		fun.serialize = QuantileBindData::Serialize;
		fun.deserialize = Deserialize;
		// temporarily push an argument so we can bind the actual quantile
		fun.arguments.emplace_back(LogicalType::LIST(LogicalType::DOUBLE));
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return fun;
	}